

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O0

void __thiscall ClientMonitor::removeAllClients(ClientMonitor *this)

{
  Client *this_00;
  size_type sVar1;
  reference ppCVar2;
  int local_1c;
  int i;
  lock_guard<std::mutex> lock;
  ClientMonitor *this_local;
  
  lock._M_device = &this->clientListAccess;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,&this->clientListAccess);
  for (local_1c = 0; sVar1 = std::vector<Client_*,_std::allocator<Client_*>_>::size(&this->clients),
      (ulong)(long)local_1c < sVar1; local_1c = local_1c + 1) {
    ppCVar2 = std::vector<Client_*,_std::allocator<Client_*>_>::operator[]
                        (&this->clients,(long)local_1c);
    if (*ppCVar2 != (value_type)0x0) {
      ppCVar2 = std::vector<Client_*,_std::allocator<Client_*>_>::operator[]
                          (&this->clients,(long)local_1c);
      this_00 = *ppCVar2;
      if (this_00 != (Client *)0x0) {
        Client::~Client(this_00);
        operator_delete(this_00);
      }
    }
  }
  Selector::clear(this->selector);
  std::vector<Client_*,_std::allocator<Client_*>_>::clear(&this->clients);
  std::
  unordered_map<TCPSocket,_Client_*,_std::hash<TCPSocket>,_std::equal_to<TCPSocket>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>_>
  ::clear(&this->socketToClientMap);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ClientMonitor::removeAllClients() {
    std::lock_guard<std::mutex> lock(clientListAccess);
    for(int i = 0; i < clients.size(); i++){
        if(clients[i] != nullptr){
            delete clients[i];
        }
    }

    selector.clear();
    clients.clear();
    socketToClientMap.clear();
}